

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sq.c
# Opt level: O2

int getargs(HSQUIRRELVM v,int argc,char **argv,SQInteger *retval)

{
  char cVar1;
  SQChar *filename;
  bool bVar2;
  SQObjectType SVar3;
  SQRESULT SVar4;
  char *filename_00;
  long lVar5;
  int iVar6;
  char *local_40;
  SQChar *err;
  
  *retval = 0;
  if (argc < 2) {
    return 0;
  }
  iVar6 = 1;
  local_40 = (char *)0x0;
  bVar2 = false;
  while( true ) {
    if (argc - iVar6 == 0 || argc < iVar6) {
      return 0;
    }
    lVar5 = (long)iVar6;
    filename = argv[lVar5];
    if (*filename != '-') break;
    cVar1 = filename[1];
    if (cVar1 == 'c') {
      bVar2 = true;
    }
    else if (cVar1 == 'd') {
      sq_enabledebuginfo(v,1);
    }
    else {
      if (cVar1 != 'o') {
        if (cVar1 == 'h') {
          PrintVersionInfos();
          PrintUsage();
        }
        else {
          if (cVar1 != 'v') {
            PrintVersionInfos();
            printf("unknown prameter \'-%c\'\n",(ulong)(uint)(int)argv[lVar5][1]);
            PrintUsage();
            *retval = -1;
            return 3;
          }
          PrintVersionInfos();
        }
        return 2;
      }
      iVar6 = iVar6 + 1;
      local_40 = argv[lVar5 + 1];
    }
    iVar6 = iVar6 + 1;
  }
  SVar4 = sqstd_loadfile(v,filename,1);
  if (bVar2) {
    if (-1 < SVar4) {
      filename_00 = "out.cnut";
      if (local_40 != (char *)0x0) {
        filename_00 = local_40;
      }
      SVar4 = sqstd_writeclosuretofile(v,filename_00);
      if (-1 < SVar4) {
        return 2;
      }
    }
  }
  else if (-1 < SVar4) {
    sq_pushroottable(v);
    while (lVar5 = lVar5 + 1, lVar5 < (long)(ulong)(uint)argc) {
      sq_pushstring(v,argv[lVar5],-1);
    }
    SVar4 = sq_call(v,(ulong)(uint)(argc - iVar6),1,1);
    if (SVar4 < 0) {
      return 3;
    }
    SVar3 = sq_gettype(v,-1);
    if (SVar3 == OT_INTEGER) {
      *retval = 0x5000002;
      sq_getinteger(v,-1,retval);
      return 2;
    }
    return 2;
  }
  sq_getlasterror(v);
  SVar4 = sq_getstring(v,-1,&err);
  if (SVar4 < 0) {
    return 0;
  }
  printf("Error [%s]\n",err);
  *retval = -2;
  return 3;
}

Assistant:

int getargs(HSQUIRRELVM v,int argc, char* argv[],SQInteger *retval)
{
    int i;
    int compiles_only = 0;
#ifdef SQUNICODE
    static SQChar temp[500];
#endif
    char * output = NULL;
    *retval = 0;
    if(argc>1)
    {
        int arg=1,exitloop=0;

        while(arg < argc && !exitloop)
        {

            if(argv[arg][0]=='-')
            {
                switch(argv[arg][1])
                {
                case 'd': //DEBUG(debug infos)
                    sq_enabledebuginfo(v,1);
                    break;
                case 'c':
                    compiles_only = 1;
                    break;
                case 'o':
                    if(arg < argc) {
                        arg++;
                        output = argv[arg];
                    }
                    break;
                case 'v':
                    PrintVersionInfos();
                    return _DONE;

                case 'h':
                    PrintVersionInfos();
                    PrintUsage();
                    return _DONE;
                default:
                    PrintVersionInfos();
                    scprintf(_SC("unknown prameter '-%c'\n"),argv[arg][1]);
                    PrintUsage();
                    *retval = -1;
                    return _ERROR;
                }
            }else break;
            arg++;
        }

        // src file

        if(arg<argc) {
            const SQChar *filename=NULL;
#ifdef SQUNICODE
            mbstowcs(temp,argv[arg],strlen(argv[arg]));
            filename=temp;
#else
            filename=argv[arg];
#endif

            arg++;

            //sq_pushstring(v,_SC("ARGS"),-1);
            //sq_newarray(v,0);

            //sq_createslot(v,-3);
            //sq_pop(v,1);
            if(compiles_only) {
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))){
                    const SQChar *outfile = _SC("out.cnut");
                    if(output) {
#ifdef SQUNICODE
                        int len = (int)(strlen(output)+1);
                        mbstowcs(sq_getscratchpad(v,len*sizeof(SQChar)),output,len);
                        outfile = sq_getscratchpad(v,-1);
#else
                        outfile = output;
#endif
                    }
                    if(SQ_SUCCEEDED(sqstd_writeclosuretofile(v,outfile)))
                        return _DONE;
                }
            }
            else {
                //if(SQ_SUCCEEDED(sqstd_dofile(v,filename,SQFalse,SQTrue))) {
                    //return _DONE;
                //}
                if(SQ_SUCCEEDED(sqstd_loadfile(v,filename,SQTrue))) {
                    int callargs = 1;
                    sq_pushroottable(v);
                    for(i=arg;i<argc;i++)
                    {
                        const SQChar *a;
#ifdef SQUNICODE
                        int alen=(int)strlen(argv[i]);
                        a=sq_getscratchpad(v,(int)(alen*sizeof(SQChar)));
                        mbstowcs(sq_getscratchpad(v,-1),argv[i],alen);
                        sq_getscratchpad(v,-1)[alen] = _SC('\0');
#else
                        a=argv[i];
#endif
                        sq_pushstring(v,a,-1);
                        callargs++;
                        //sq_arrayappend(v,-2);
                    }
                    if(SQ_SUCCEEDED(sq_call(v,callargs,SQTrue,SQTrue))) {
                        SQObjectType type = sq_gettype(v,-1);
                        if(type == OT_INTEGER) {
                            *retval = type;
                            sq_getinteger(v,-1,retval);
                        }
                        return _DONE;
                    }
                    else{
                        return _ERROR;
                    }

                }
            }
            //if this point is reached an error occurred
            {
                const SQChar *err;
                sq_getlasterror(v);
                if(SQ_SUCCEEDED(sq_getstring(v,-1,&err))) {
                    scprintf(_SC("Error [%s]\n"),err);
                    *retval = -2;
                    return _ERROR;
                }
            }

        }
    }

    return _INTERACTIVE;
}